

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

TargetOrString * __thiscall
cmGeneratorTarget::ResolveTargetReference
          (TargetOrString *__return_storage_ptr__,cmGeneratorTarget *this,string *name)

{
  cmLocalGenerator *pcVar1;
  cmGeneratorTarget *pcVar2;
  cmGeneratorTarget *tgt;
  cmLocalGenerator *otherLG;
  undefined1 local_a8 [8];
  cmDirectoryId dirId;
  string local_78 [32];
  string local_58 [8];
  string plainName;
  size_type pos;
  string *lookupName;
  cmLocalGenerator *lg;
  string *name_local;
  cmGeneratorTarget *this_local;
  TargetOrString *resolved;
  
  lookupName = (string *)this->LocalGenerator;
  plainName.field_2._8_8_ = std::__cxx11::string::find((char *)name,0x86c308);
  std::__cxx11::string::string(local_58);
  pos = (size_type)name;
  if (plainName.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_78,(ulong)name);
    std::__cxx11::string::operator=(local_58,local_78);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::substr((ulong)&otherLG,(ulong)name);
    cmDirectoryId::cmDirectoryId((cmDirectoryId *)local_a8,(string *)&otherLG);
    std::__cxx11::string::~string((string *)&otherLG);
    pcVar1 = cmGlobalGenerator::FindLocalGenerator(this->GlobalGenerator,(cmDirectoryId *)local_a8);
    if (pcVar1 != (cmLocalGenerator *)0x0) {
      pos = (size_type)local_58;
      lookupName = (string *)pcVar1;
    }
    cmDirectoryId::~cmDirectoryId((cmDirectoryId *)local_a8);
  }
  TargetOrString::TargetOrString(__return_storage_ptr__);
  pcVar2 = cmLocalGenerator::FindGeneratorTargetToUse((cmLocalGenerator *)lookupName,(string *)pos);
  if (pcVar2 == (cmGeneratorTarget *)0x0) {
    if ((string *)pos == local_58) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_58);
    }
    else {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)name);
    }
  }
  else {
    __return_storage_ptr__->Target = pcVar2;
  }
  std::__cxx11::string::~string(local_58);
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::TargetOrString cmGeneratorTarget::ResolveTargetReference(
  std::string const& name) const
{
  cmLocalGenerator const* lg = this->LocalGenerator;
  std::string const* lookupName = &name;

  // When target_link_libraries() is called with a LHS target that is
  // not created in the calling directory it adds a directory id suffix
  // that we can use to look up the calling directory.  It is that scope
  // in which the item name is meaningful.  This case is relatively rare
  // so we allocate a separate string only when the directory id is present.
  std::string::size_type pos = name.find(CMAKE_DIRECTORY_ID_SEP);
  std::string plainName;
  if (pos != std::string::npos) {
    // We will look up the plain name without the directory id suffix.
    plainName = name.substr(0, pos);

    // We will look up in the scope of the directory id.
    // If we do not recognize the id then leave the original
    // syntax in place to produce an indicative error later.
    cmDirectoryId const dirId =
      name.substr(pos + sizeof(CMAKE_DIRECTORY_ID_SEP) - 1);
    if (cmLocalGenerator const* otherLG =
          this->GlobalGenerator->FindLocalGenerator(dirId)) {
      lg = otherLG;
      lookupName = &plainName;
    }
  }

  TargetOrString resolved;

  if (cmGeneratorTarget* tgt = lg->FindGeneratorTargetToUse(*lookupName)) {
    resolved.Target = tgt;
  } else if (lookupName == &plainName) {
    resolved.String = std::move(plainName);
  } else {
    resolved.String = name;
  }

  return resolved;
}